

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboCompletenessTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles3::Functional::NumSamplesTest::build(NumSamplesTest *this,FboBuilder *builder)

{
  int iVar1;
  GLenum attPoint;
  uint uVar2;
  GLuint GVar3;
  Renderbuffer *rbCfg;
  RenderbufferAttachment *att;
  NotSupportedError *this_00;
  ImageFormat format;
  long lVar4;
  Renderbuffer *local_38;
  
  lVar4 = 0;
  do {
    iVar1 = *(int *)((long)(this->super_ParamTest<deqp::gles3::Functional::NumSamplesParams>).
                           m_params.numSamples + lVar4);
    if (iVar1 != -2) {
      attPoint = *(GLenum *)((long)build::s_targets + lVar4);
      uVar2 = *(uint *)((long)build::s_formats + lVar4);
      format.unsizedType = 0;
      format.format = uVar2;
      if (iVar1 == -1) {
        deqp::gls::fboc::details::TestBase::attachTargetToNew
                  ((TestBase *)this,attPoint,0x1702,format,0x40,0x40,builder);
      }
      else {
        rbCfg = (Renderbuffer *)operator_new(0x20);
        (rbCfg->super_Image).internalFormat.format = 0;
        (rbCfg->super_Image).internalFormat.unsizedType = 0;
        (rbCfg->super_Image).width = 0;
        (rbCfg->super_Image).height = 0;
        (rbCfg->super_Image).super_Config._vptr_Config = (_func_int **)&PTR__Config_00d391b0;
        rbCfg->numSamples = 0;
        local_38 = rbCfg;
        std::
        _Rb_tree<deqp::gls::FboUtil::config::Config*,deqp::gls::FboUtil::config::Config*,std::_Identity<deqp::gls::FboUtil::config::Config*>,std::less<deqp::gls::FboUtil::config::Config*>,std::allocator<deqp::gls::FboUtil::config::Config*>>
        ::_M_insert_unique<deqp::gls::FboUtil::config::Config*>
                  ((_Rb_tree<deqp::gls::FboUtil::config::Config*,deqp::gls::FboUtil::config::Config*,std::_Identity<deqp::gls::FboUtil::config::Config*>,std::less<deqp::gls::FboUtil::config::Config*>,std::allocator<deqp::gls::FboUtil::config::Config*>>
                    *)&builder->m_configs,(Config **)&local_38);
        (rbCfg->super_Image).internalFormat.format = uVar2;
        *(undefined8 *)&(rbCfg->super_Image).internalFormat.unsizedType = 0x4000000000;
        (rbCfg->super_Image).height = 0x40;
        rbCfg->numSamples = iVar1;
        GVar3 = deqp::gls::FboUtil::FboBuilder::glCreateRbo(builder,rbCfg);
        if (builder->m_error == 0x502) {
          this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
          tcu::NotSupportedError::NotSupportedError
                    (this_00,"Unsupported number of samples",
                     "builder.getError() != GL_INVALID_OPERATION",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFboCompletenessTests.cpp"
                     ,0x1a9);
          __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
        }
        att = deqp::gls::FboUtil::FboBuilder::
              makeConfig<deqp::gls::FboUtil::config::RenderbufferAttachment>(builder);
        (att->super_Attachment).imageName = GVar3;
        deqp::gls::FboUtil::FboBuilder::glAttach(builder,attPoint,&att->super_Attachment);
      }
    }
    lVar4 = lVar4 + 4;
  } while (lVar4 != 0xc);
  return STOP;
}

Assistant:

IterateResult NumSamplesTest::build (FboBuilder& builder)
{
	static const GLenum s_targets[] =
		{
			GL_COLOR_ATTACHMENT0,	GL_COLOR_ATTACHMENT1,	GL_DEPTH_ATTACHMENT,
		};
	// Non-integer formats for each attachment type.
	// \todo [2013-12-17 lauri] Add fixed/floating/integer metadata for formats so
	// we can pick one smartly or maybe try several.
	static const GLenum s_formats[] =
		{
			GL_RGBA8,				GL_RGB565,				GL_DEPTH_COMPONENT24,
		};
	DE_STATIC_ASSERT(DE_LENGTH_OF_ARRAY(s_targets) == DE_LENGTH_OF_ARRAY(m_params.numSamples));

	for (int i = 0; i < DE_LENGTH_OF_ARRAY(s_targets); i++)
	{
		const GLenum target = s_targets[i];
		const ImageFormat fmt = { s_formats[i], GL_NONE };

		const GLsizei ns = m_params.numSamples[i];
		if (ns == -2)
			continue;

		if (ns == -1)
		{
			attachTargetToNew(target, GL_TEXTURE, fmt, 64, 64, builder);
		}
		else
		{
			Renderbuffer& rboCfg = builder.makeConfig<Renderbuffer>();
			rboCfg.internalFormat = fmt;
			rboCfg.width = rboCfg.height = 64;
			rboCfg.numSamples = ns;

			const GLuint rbo = builder.glCreateRbo(rboCfg);
			// Implementations do not necessarily support sample sizes greater than 1.
			TCU_CHECK_AND_THROW(NotSupportedError,
								builder.getError() != GL_INVALID_OPERATION,
								"Unsupported number of samples");
			RenderbufferAttachment& att = builder.makeConfig<RenderbufferAttachment>();
			att.imageName = rbo;
			builder.glAttach(target, &att);
		}
	}

	return STOP;
}